

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O1

char * __thiscall
htmlcxx2::HTML::ParserSax::skipComment<char_const*>(ParserSax *this,char *pos,char *end)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  
  if (pos != end) {
    do {
      pbVar4 = (byte *)pos + 1;
      if ((pbVar4 != (byte *)end && *pos == 0x2d) && (*pbVar4 == 0x2d)) {
        pbVar1 = (byte *)pos + 2;
        do {
          pbVar3 = pbVar1;
          if (pbVar3 == (byte *)end) {
            bVar5 = false;
            pbVar4 = (byte *)end;
            goto LAB_00157c1e;
          }
          iVar2 = isspace((uint)*pbVar3);
          pbVar1 = pbVar3 + 1;
        } while (iVar2 != 0);
        if (pbVar3 == (byte *)end) {
          bVar5 = false;
          pbVar4 = pbVar3;
        }
        else {
          bVar5 = *pbVar3 != 0x3e;
          if (!bVar5) {
            pbVar4 = pbVar3 + 1;
          }
        }
LAB_00157c1e:
        if (!bVar5) {
          return (char *)pbVar4;
        }
      }
      pos = (char *)pbVar4;
    } while (pos != end);
  }
  return (char *)(byte *)pos;
}

Assistant:

It ParserSax::skipComment(It pos, It end)
{
    while (pos != end)
    {
        if (*pos++ == '-' && pos != end && *pos == '-')
        {
            It d(pos);
            while (++pos != end && ::isspace((unsigned char)*pos))
                ;
            if (pos == end || *pos++ == '>')
                break;
            pos = d;
        }
    }
    return pos;
}